

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::DragScalar(char *label,ImGuiDataType data_type,void *v,float v_speed,void *v_min,
                      void *v_max,char *format,float power)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  ImGuiID id_00;
  int iVar5;
  ImGuiWindow *window_00;
  int in_ESI;
  char *in_R9;
  float fVar6;
  float _x;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImVec2 v_max_00;
  ImVec2 format_00;
  char *value_buf_end;
  char value_buf [64];
  ImU32 frame_col;
  bool value_changed;
  bool tab_focus_requested;
  bool start_text_input;
  bool hovered;
  ImRect total_bb;
  ImRect inner_bb;
  ImRect frame_bb;
  ImVec2 label_size;
  float w;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe48;
  float text_offset_y;
  void *data_ptr;
  ImGuiWindow *in_stack_fffffffffffffe50;
  ImRect *in_stack_fffffffffffffe58;
  char *in_stack_fffffffffffffe60;
  ImGuiWindow *in_stack_fffffffffffffe68;
  ImGuiWindow *in_stack_fffffffffffffe70;
  ImGuiID id_01;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 uVar9;
  ImVec2 *this;
  undefined4 in_stack_fffffffffffffe88;
  undefined1 hide_text_after_hash;
  char *text;
  ImVec2 *this_00;
  ImVec2 pos;
  ImRect *pIVar10;
  ImVec2 in_stack_fffffffffffffec0;
  ImVec2 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  ImGuiDataType data_type_00;
  char *in_stack_fffffffffffffed8;
  ImGuiID in_stack_fffffffffffffee4;
  ImRect *in_stack_fffffffffffffee8;
  ImGuiNavHighlightFlags in_stack_fffffffffffffef8;
  ImGuiID in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  ImVec2 local_d0;
  ImVec2 local_c8 [2];
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff6c;
  ImVec2 in_stack_ffffffffffffff70;
  float fVar11;
  float in_stack_ffffffffffffff80;
  float local_78 [2];
  float flags;
  float fStack_6c;
  bool local_1;
  
  data_type_00 = (ImGuiDataType)((ulong)in_stack_fffffffffffffed0 >> 0x20);
  window_00 = GetCurrentWindow();
  pIVar2 = GImGui;
  if ((window_00->SkipItems & 1U) == 0) {
    text = (char *)0x0;
    id_00 = ImGuiWindow::GetID(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                               in_stack_fffffffffffffe60);
    fVar6 = CalcItemWidth();
    IVar7 = CalcTextSize((char *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                         (char *)in_stack_fffffffffffffe70,
                         SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                         SUB84(in_stack_fffffffffffffe68,0));
    id_01 = (ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20);
    pos = (ImVec2)&window_00->DC;
    fStack_6c = IVar7.y;
    fVar11 = (pIVar2->Style).FramePadding.y;
    this_00 = (ImVec2 *)&stack0xffffffffffffff70;
    ImVec2::ImVec2(this_00,fVar6,fVar11 + fVar11 + fStack_6c);
    IVar8 = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x16561d);
    fVar11 = IVar8.y;
    pIVar10 = (ImRect *)&stack0xffffffffffffff80;
    ImRect::ImRect(pIVar10,(ImVec2 *)pos,(ImVec2 *)&stack0xffffffffffffff78);
    fVar6 = (float)((ulong)pIVar10 >> 0x20);
    v_max_00 = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x16565b);
    format_00 = operator-(in_stack_fffffffffffffe48,(ImVec2 *)0x16567d);
    ImRect::ImRect((ImRect *)&stack0xffffffffffffff60,(ImVec2 *)&stack0xffffffffffffff58,
                   (ImVec2 *)&stack0xffffffffffffff50);
    pIVar10 = (ImRect *)&stack0xffffffffffffff80;
    IVar8 = (ImVec2)local_78;
    flags = IVar7.x;
    if (flags <= 0.0) {
      _x = 0.0;
    }
    else {
      _x = (pIVar2->Style).ItemInnerSpacing.x + flags;
    }
    this = &local_d0;
    ImVec2::ImVec2(this,_x,0.0);
    local_c8[0] = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x165725);
    text_offset_y = (float)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    ImRect::ImRect((ImRect *)(local_c8 + 1),&pIVar10->Min,local_c8);
    bVar3 = ItemAdd((ImRect *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),id_01,
                    (ImRect *)in_stack_fffffffffffffe68);
    if (bVar3) {
      bVar3 = ItemHoverable(in_stack_fffffffffffffe58,
                            (ImGuiID)((ulong)in_stack_fffffffffffffe50 >> 0x20));
      if (((in_R9 != (char *)0x0) && (in_ESI == 0)) && (iVar5 = strcmp(in_R9,"%d"), iVar5 != 0)) {
        PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe58);
      }
      bVar1 = false;
      bVar4 = FocusableItemRegister
                        (in_stack_fffffffffffffe68,
                         (ImGuiID)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                         SUB81((ulong)in_stack_fffffffffffffe60 >> 0x18,0));
      if ((bVar4) ||
         ((((bVar3 && ((((pIVar2->IO).MouseClicked[0] & 1U) != 0 ||
                       (((pIVar2->IO).MouseDoubleClicked[0] & 1U) != 0)))) ||
           (pIVar2->NavActivateId == id_00)) ||
          ((pIVar2->NavInputId == id_00 && (pIVar2->ScalarAsInputTextId != id_00)))))) {
        SetActiveID(id_00,window_00);
        SetFocusID((ImGuiID)((ulong)this >> 0x20),
                   (ImGuiWindow *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        FocusWindow(in_stack_fffffffffffffe50);
        pIVar2->ActiveIdAllowNavDirFlags = 0xc;
        if ((bVar4) ||
           (((((pIVar2->IO).KeyCtrl & 1U) != 0 || (((pIVar2->IO).MouseDoubleClicked[0] & 1U) != 0))
            || (pIVar2->NavInputId == id_00)))) {
          bVar1 = true;
          pIVar2->ScalarAsInputTextId = 0;
        }
      }
      if ((bVar1) || ((pIVar2->ActiveId == id_00 && (pIVar2->ScalarAsInputTextId == id_00)))) {
        FocusableItemUnregister(window_00);
        local_1 = InputScalarAsWidgetReplacement
                            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                             in_stack_fffffffffffffed8,data_type_00,
                             (void *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0);
      }
      else {
        ItemSize((ImRect *)in_stack_fffffffffffffe50,text_offset_y);
        data_ptr = (void *)((ulong)(uint)text_offset_y << 0x20);
        local_1 = DragBehavior((ImGuiID)in_stack_ffffffffffffff80,(ImGuiDataType)fVar11,
                               (void *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                               (void *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                               ,(void *)v_max_00,(char *)format_00,in_stack_ffffffffffffff4c,
                               (ImGuiDragFlags)flags);
        if (local_1) {
          MarkItemEdited(id_00);
        }
        if (pIVar2->ActiveId == id_00) {
          uVar9 = 9;
        }
        else {
          uVar9 = 7;
          if (pIVar2->HoveredId == id_00) {
            uVar9 = 8;
          }
        }
        GetColorU32((ImGuiCol)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                    SUB84(in_stack_fffffffffffffe60,0));
        RenderNavHighlight(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                           in_stack_fffffffffffffef8);
        RenderFrame(in_stack_fffffffffffffec0,IVar8,(ImU32)((ulong)pIVar10 >> 0x20),
                    SUB81((ulong)pIVar10 >> 0x18,0),fVar6);
        DataTypeFormatString
                  ((char *)in_stack_fffffffffffffe58,(int)((ulong)&stack0xfffffffffffffed8 >> 0x20),
                   (ImGuiDataType)&stack0xfffffffffffffed8,data_ptr,(char *)0x165b76);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec8,0.5,0.5);
        RenderTextClipped((ImVec2 *)pos,this_00,text,(char *)CONCAT44(_x,in_stack_fffffffffffffe88),
                          this,(ImVec2 *)CONCAT44(uVar9,in_stack_fffffffffffffe78),pIVar10);
        hide_text_after_hash = (undefined1)((uint)_x >> 0x18);
        if (0.0 < flags) {
          ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffec0,
                         local_78[0] + (pIVar2->Style).ItemInnerSpacing.x,in_stack_ffffffffffffff64)
          ;
          RenderText(pos,(char *)this_00,text,(bool)hide_text_after_hash);
        }
      }
    }
    else {
      ItemSize((ImRect *)in_stack_fffffffffffffe50,text_offset_y);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::DragScalar(const char* label, ImGuiDataType data_type, void* v, float v_speed, const void* v_min, const void* v_max, const char* format, float power)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (power != 1.0f)
        IM_ASSERT(v_min != NULL && v_max != NULL); // When using a power curve the drag needs to have known bounds

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    const float w = CalcItemWidth();

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y*2.0f));
    const ImRect inner_bb(frame_bb.Min + style.FramePadding, frame_bb.Max - style.FramePadding);
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    // NB- we don't call ItemSize() yet because we may turn into a text edit box below
    if (!ItemAdd(total_bb, id, &frame_bb))
    {
        ItemSize(total_bb, style.FramePadding.y);
        return false;
    }
    const bool hovered = ItemHoverable(frame_bb, id);

    // Default format string when passing NULL
    // Patch old "%.0f" format string to use "%d", read function comments for more details.
    IM_ASSERT(data_type >= 0 && data_type < ImGuiDataType_COUNT);
    if (format == NULL)
        format = GDataTypeInfo[data_type].PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0)
        format = PatchFormatStringFloatToInt(format);

    // Tabbing or CTRL-clicking on Drag turns it into an input box
    bool start_text_input = false;
    const bool tab_focus_requested = FocusableItemRegister(window, id);
    if (tab_focus_requested || (hovered && (g.IO.MouseClicked[0] || g.IO.MouseDoubleClicked[0])) || g.NavActivateId == id || (g.NavInputId == id && g.ScalarAsInputTextId != id))
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
        if (tab_focus_requested || g.IO.KeyCtrl || g.IO.MouseDoubleClicked[0] || g.NavInputId == id)
        {
            start_text_input = true;
            g.ScalarAsInputTextId = 0;
        }
    }
    if (start_text_input || (g.ActiveId == id && g.ScalarAsInputTextId == id))
    {
        FocusableItemUnregister(window);
        return InputScalarAsWidgetReplacement(frame_bb, id, label, data_type, v, format);
    }

    // Actual drag behavior
    ItemSize(total_bb, style.FramePadding.y);
    const bool value_changed = DragBehavior(id, data_type, v, v_speed, v_min, v_max, format, power, ImGuiDragFlags_None);
    if (value_changed)
        MarkItemEdited(id);

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, v, format);
    RenderTextClipped(frame_bb.Min, frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.5f));

    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, inner_bb.Min.y), label);

    return value_changed;
}